

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O1

AST * parse_unary_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  char cVar2;
  AST_Error *pAVar3;
  AST_Unary_Expression *pAVar4;
  Type *pTVar5;
  AST *pAVar6;
  AST_Type type;
  
  if (translation_data->tokens->size == 0) {
    push_translation_error("expected something here",translation_data);
    pAVar3 = get_error_tree((AST *)0x0);
    return (AST *)pAVar3;
  }
  iVar1 = *translation_data->tokens->first->data;
  if (iVar1 < 0x3c) {
    switch(iVar1) {
    case 0x21:
      chomp(translation_data);
      pAVar6 = parse_cast_expression(translation_data,scope);
      type = OP_LOGICAL_NOT;
      break;
    case 0x22:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2a:
switchD_001427dc_caseD_22:
      pAVar6 = parse_postfix_expression(translation_data,scope);
      return pAVar6;
    case 0x24:
      chomp(translation_data);
      pAVar6 = parse_cast_expression(translation_data,scope);
      type = OP_ADDR_OF;
      break;
    case 0x28:
      chomp(translation_data);
      pAVar6 = parse_cast_expression(translation_data,scope);
      type = OP_DEREFERENCE;
      break;
    case 0x29:
      chomp(translation_data);
      pAVar6 = parse_cast_expression(translation_data,scope);
      type = OP_UNARY_PLUS;
      break;
    case 0x2b:
      chomp(translation_data);
      pAVar6 = parse_cast_expression(translation_data,scope);
      type = OP_UNARY_MINUS;
      break;
    default:
      if (iVar1 != 0x1b) goto switchD_001427dc_caseD_22;
      chomp(translation_data);
      cVar2 = get_and_check(translation_data,KW_OPEN_NORMAL);
      if (cVar2 != '\0') {
        pAVar4 = get_unary_expression_tree((AST *)0x0,OP_CAST);
        pTVar5 = parse_type_name(translation_data,scope);
        pAVar4->value_type = pTVar5;
        pAVar6 = parse_unary_expression(translation_data,scope);
        pAVar4->operand = pAVar6;
        return (AST *)pAVar4;
      }
      pAVar6 = parse_unary_expression(translation_data,scope);
      type = OP_SIZEOF;
    }
  }
  else if (iVar1 == 0x3c) {
    chomp(translation_data);
    pAVar6 = parse_cast_expression(translation_data,scope);
    type = OP_BITWISE_NOT;
  }
  else if (iVar1 == 0x3e) {
    chomp(translation_data);
    pAVar6 = parse_unary_expression(translation_data,scope);
    type = OP_PREFIX_DEC;
  }
  else {
    if (iVar1 != 0x3d) goto switchD_001427dc_caseD_22;
    chomp(translation_data);
    pAVar6 = parse_unary_expression(translation_data,scope);
    type = OP_PREFIX_INC;
  }
  pAVar4 = get_unary_expression_tree(pAVar6,type);
  return (AST *)pAVar4;
}

Assistant:

struct AST* parse_unary_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct AST_Unary_Expression *hold;

	if(translation_data->tokens->size==0)
	{
		/*TODO error*/
		push_translation_error("expected something here",translation_data);
		return (struct AST*)get_error_tree(NULL);
	}

	/*TODO make it iterative*/
	switch(((struct token*)translation_data->tokens->first->data)->type)
	{
		case KW_PLUSPLUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_unary_expression(translation_data,scope),OP_PREFIX_INC);
		case KW_MINUSMINUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_unary_expression(translation_data,scope),OP_PREFIX_DEC);
		case KW_PLUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_UNARY_PLUS);
		case KW_MINUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_UNARY_MINUS);
		case KW_EXCLAMATION:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_LOGICAL_NOT);
		case KW_TILDE:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_BITWISE_NOT);
		case KW_STAR:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_DEREFERENCE);
		case KW_AND:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_ADDR_OF);
		case KW_SIZEOF:
			chomp(translation_data);
			if(get_and_check(translation_data,KW_OPEN_NORMAL))
			{
				hold=get_unary_expression_tree(NULL,OP_CAST);
				hold->value_type=parse_type_name(translation_data,scope);
				hold->operand=parse_unary_expression(translation_data,scope);
				return (struct AST*)hold;
			}else
			{
				return (struct AST*)get_unary_expression_tree(parse_unary_expression(translation_data,scope),OP_SIZEOF);
			}
		default:
			return parse_postfix_expression(translation_data,scope);
	}

}